

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexHashMap.h
# Opt level: O2

PtexCachedReader * __thiscall
Ptex::v2_2::PtexHashMap<Ptex::v2_2::StringKey,_Ptex::v2_2::PtexCachedReader_*>::tryInsert
          (PtexHashMap<Ptex::v2_2::StringKey,_Ptex::v2_2::PtexCachedReader_*> *this,StringKey *key,
          PtexCachedReader *value,size_t *newMemUsed)

{
  Entry *this_00;
  uint32_t uVar1;
  PtexCachedReader *pPVar2;
  bool bVar3;
  uint uVar4;
  Entry *pEVar5;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *extraout_RDX_00;
  uint32_t uVar6;
  
  pEVar5 = lockEntriesAndGrowIfNeeded(this,newMemUsed);
  uVar1 = this->_numEntries;
  uVar6 = key->_hash;
  src = extraout_RDX;
  do {
    uVar4 = uVar6 & uVar1 - 1;
    this_00 = pEVar5 + uVar4;
    if (pEVar5[uVar4].value == (PtexCachedReader *)0x0) {
      this_00->value = value;
      this->_size = this->_size + 1;
      StringKey::copy(&this_00->key,(EVP_PKEY_CTX *)key,src);
      break;
    }
    do {
    } while ((this_00->key)._val == (char *)0x0);
    bVar3 = StringKey::matches(&this_00->key,key);
    uVar6 = uVar6 + 1;
    src = extraout_RDX_00;
  } while (!bVar3);
  pPVar2 = this_00->value;
  this->_entries = pEVar5;
  return pPVar2;
}

Assistant:

Value tryInsert(Key& key, Value value, size_t& newMemUsed)
    {
        Entry* entries = lockEntriesAndGrowIfNeeded(newMemUsed);
        uint32_t mask = _numEntries-1;
        uint32_t hash = key.hash();

        Value result = 0;
        for (uint32_t i = hash;; ++i) {
            Entry& e = entries[i & mask];
            if (e.value == 0) {
                e.value = value;
                ++_size;
                PtexMemoryFence();
                e.key.copy(key);
                result = e.value;
                break;
            }
            while (e.key.isEmpty()) ;
            if (e.key.matches(key)) {
                result = e.value;
                break;
            }
        }
        unlockEntries(entries);
        return result;
    }